

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_case.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::UnicodeString::caseMap
          (UnicodeString *this,int32_t caseLocale,uint32_t options,BreakIterator *iter,
          UStringCaseMapper *stringCaseMapper)

{
  ushort uVar1;
  UBool UVar2;
  int32_t iVar3;
  char16_t *pcVar4;
  int textLength;
  char16_t *pcVar5;
  bool bVar6;
  UErrorCode errorCode;
  uint32_t local_3d0;
  int32_t local_3cc;
  UStringCaseMapper *local_3c8;
  ConstChar16Ptr local_3c0;
  ConstChar16Ptr local_3b8;
  UChar *local_3b0;
  char16_t *local_3a0;
  UnicodeString oldString;
  Iterator ei;
  Edits edits;
  UChar oldBuffer [54];
  int32_t *bufferToDelete;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) != 0 || uVar1 < 0x20) {
    return this;
  }
  if ((short)uVar1 < 0) {
    textLength = (this->fUnion).fFields.fLength;
  }
  else {
    textLength = (int)(short)uVar1 >> 5;
  }
  local_3cc = caseLocale;
  if (((uVar1 & 8) == 0) && (((uVar1 & 4) == 0 || (iVar3 = refCount(this), iVar3 == 1)))) {
    if (textLength < 0x37) {
      bVar6 = false;
      goto LAB_002f0015;
    }
LAB_002f007d:
    oldString.fUnion.fStackFields.fLengthAndFlags = 2;
    oldString.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f5be0;
    errorCode = U_ZERO_ERROR;
    if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      pcVar5 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar5 = (this->fUnion).fStackFields.fBuffer;
    }
    edits.array = edits.stackArray;
    edits.capacity = 100;
    edits.length = 0;
    edits.delta = 0;
    edits.numChanges = 0;
    edits.errorCode_ = U_ZERO_ERROR;
    if (iter != (BreakIterator *)0x0) {
      local_3c0.p_ = pcVar5;
      setTo(&oldString,'\0',&local_3c0,textLength);
      local_3a0 = local_3c0.p_;
      (*(iter->super_UObject)._vptr_UObject[7])(iter,&oldString);
    }
    (*stringCaseMapper)(local_3cc,options | 0x4000,iter,(char16_t *)&bufferToDelete,200,pcVar5,
                        textLength,&edits,&errorCode);
    if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((edits.delta < 1) ||
         (UVar2 = cloneArrayIfNeeded(this,edits.delta + textLength,edits.delta + textLength,'\x01',
                                     (int32_t **)0x0,'\0'), UVar2 != '\0')) {
        Edits::Iterator::Iterator(&ei,edits.array,edits.length,'\x01','\x01');
        while (UVar2 = Edits::Iterator::next(&ei,ei.onlyChanges_,&errorCode), UVar2 != '\0') {
          doReplace(this,ei.destIndex,ei.oldLength_,(UChar *)&bufferToDelete,ei.replIndex,
                    ei.newLength_);
        }
        if (U_ZERO_ERROR < errorCode) goto LAB_002f034d;
      }
LAB_002f0355:
      Edits::~Edits(&edits);
      goto LAB_002f037a;
    }
    if (errorCode != U_BUFFER_OVERFLOW_ERROR) {
LAB_002f034d:
      setToBogus(this);
      goto LAB_002f0355;
    }
    iVar3 = edits.delta + textLength;
    local_3d0 = options;
    Edits::~Edits(&edits);
LAB_002f01e5:
    bufferToDelete = (int32_t *)0x0;
    UVar2 = cloneArrayIfNeeded(this,iVar3,iVar3,'\0',&bufferToDelete,'\x01');
    if (UVar2 == '\0') goto LAB_002f037a;
    errorCode = U_ZERO_ERROR;
    bVar6 = ((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0;
    pcVar4 = (this->fUnion).fStackFields.fBuffer;
    if (bVar6) {
      pcVar4 = (this->fUnion).fFields.fArray;
    }
    iVar3 = 0x1b;
    if (bVar6) {
      iVar3 = (this->fUnion).fFields.fCapacity;
    }
    iVar3 = (*stringCaseMapper)(local_3cc,local_3d0,iter,pcVar4,iVar3,pcVar5,textLength,(Edits *)0x0
                                ,&errorCode);
    if (bufferToDelete != (int32_t *)0x0) {
      uprv_free_63(bufferToDelete);
    }
    if (U_ZERO_ERROR < errorCode) {
      setToBogus(this);
      goto LAB_002f037a;
    }
  }
  else {
    bVar6 = true;
    if (0x1a < textLength) goto LAB_002f007d;
LAB_002f0015:
    oldString.fUnion.fStackFields.fLengthAndFlags = 2;
    oldString.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f5be0;
    errorCode = U_ZERO_ERROR;
    pcVar5 = (this->fUnion).fStackFields.fBuffer;
    pcVar4 = pcVar5;
    if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      pcVar4 = (this->fUnion).fFields.fArray;
    }
    local_3d0 = options;
    local_3c8 = stringCaseMapper;
    u_memcpy_63(oldBuffer,pcVar4,textLength);
    if (bVar6) {
      iVar3 = 0x1b;
      UVar2 = cloneArrayIfNeeded(this,0x1b,0x1b,'\0',(int32_t **)0x0,'\0');
      pcVar4 = pcVar5;
      if (UVar2 == '\0') goto LAB_002f037a;
    }
    else {
      iVar3 = 0x1b;
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        iVar3 = (this->fUnion).fFields.fCapacity;
      }
    }
    if (iter != (BreakIterator *)0x0) {
      local_3b8.p_ = oldBuffer;
      setTo(&oldString,'\0',&local_3b8,textLength);
      local_3b0 = local_3b8.p_;
      (*(iter->super_UObject)._vptr_UObject[7])(iter,&oldString);
    }
    pcVar5 = oldBuffer;
    iVar3 = (*local_3c8)(local_3cc,local_3d0,iter,pcVar4,iVar3,pcVar5,textLength,(Edits *)0x0,
                         &errorCode);
    if (U_ZERO_ERROR < errorCode) {
      stringCaseMapper = local_3c8;
      if (errorCode != U_BUFFER_OVERFLOW_ERROR) {
        setToBogus(this);
        goto LAB_002f037a;
      }
      goto LAB_002f01e5;
    }
  }
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (iVar3 < 0x400) {
    (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(iVar3 << 5) | uVar1 & 0x1f;
  }
  else {
    (this->fUnion).fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
    (this->fUnion).fFields.fLength = iVar3;
  }
LAB_002f037a:
  ~UnicodeString(&oldString);
  return this;
}

Assistant:

UnicodeString &
UnicodeString::caseMap(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_PARAM
                       UStringCaseMapper *stringCaseMapper) {
  if(isEmpty() || !isWritable()) {
    // nothing to do
    return *this;
  }

  UChar oldBuffer[2 * US_STACKBUF_SIZE];
  UChar *oldArray;
  int32_t oldLength = length();
  int32_t newLength;
  UBool writable = isBufferWritable();
  UErrorCode errorCode = U_ZERO_ERROR;

#if !UCONFIG_NO_BREAK_ITERATION
  // Read-only alias to the original string contents for the titlecasing BreakIterator.
  // We cannot set the iterator simply to *this because *this is being modified.
  UnicodeString oldString;
#endif

  // Try to avoid heap-allocating a new character array for this string.
  if (writable ? oldLength <= UPRV_LENGTHOF(oldBuffer) : oldLength < US_STACKBUF_SIZE) {
    // Short string: Copy the contents into a temporary buffer and
    // case-map back into the current array, or into the stack buffer.
    UChar *buffer = getArrayStart();
    int32_t capacity;
    oldArray = oldBuffer;
    u_memcpy(oldBuffer, buffer, oldLength);
    if (writable) {
      capacity = getCapacity();
    } else {
      // Switch from the read-only alias or shared heap buffer to the stack buffer.
      if (!cloneArrayIfNeeded(US_STACKBUF_SIZE, US_STACKBUF_SIZE, /* doCopyArray= */ FALSE)) {
        return *this;
      }
      U_ASSERT(fUnion.fFields.fLengthAndFlags & kUsingStackBuffer);
      buffer = fUnion.fStackFields.fBuffer;
      capacity = US_STACKBUF_SIZE;
    }
#if !UCONFIG_NO_BREAK_ITERATION
    if (iter != nullptr) {
      oldString.setTo(FALSE, oldArray, oldLength);
      iter->setText(oldString);
    }
#endif
    newLength = stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                                 buffer, capacity,
                                 oldArray, oldLength, NULL, errorCode);
    if (U_SUCCESS(errorCode)) {
      setLength(newLength);
      return *this;
    } else if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
      // common overflow handling below
    } else {
      setToBogus();
      return *this;
    }
  } else {
    // Longer string or read-only buffer:
    // Collect only changes and then apply them to this string.
    // Case mapping often changes only small parts of a string,
    // and often does not change its length.
    oldArray = getArrayStart();
    Edits edits;
    UChar replacementChars[200];
#if !UCONFIG_NO_BREAK_ITERATION
    if (iter != nullptr) {
      oldString.setTo(FALSE, oldArray, oldLength);
      iter->setText(oldString);
    }
#endif
    stringCaseMapper(caseLocale, options | U_OMIT_UNCHANGED_TEXT, UCASEMAP_BREAK_ITERATOR
                     replacementChars, UPRV_LENGTHOF(replacementChars),
                     oldArray, oldLength, &edits, errorCode);
    if (U_SUCCESS(errorCode)) {
      // Grow the buffer at most once, not for multiple doReplace() calls.
      newLength = oldLength + edits.lengthDelta();
      if (newLength > oldLength && !cloneArrayIfNeeded(newLength, newLength)) {
        return *this;
      }
      for (Edits::Iterator ei = edits.getCoarseChangesIterator(); ei.next(errorCode);) {
        doReplace(ei.destinationIndex(), ei.oldLength(),
                  replacementChars, ei.replacementIndex(), ei.newLength());
      }
      if (U_FAILURE(errorCode)) {
        setToBogus();
      }
      return *this;
    } else if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
      // common overflow handling below
      newLength = oldLength + edits.lengthDelta();
    } else {
      setToBogus();
      return *this;
    }
  }

  // Handle buffer overflow, newLength is known.
  // We need to allocate a new buffer for the internal string case mapping function.
  // This is very similar to how doReplace() keeps the old array pointer
  // and deletes the old array itself after it is done.
  // In addition, we are forcing cloneArrayIfNeeded() to always allocate a new array.
  int32_t *bufferToDelete = 0;
  if (!cloneArrayIfNeeded(newLength, newLength, FALSE, &bufferToDelete, TRUE)) {
    return *this;
  }
  errorCode = U_ZERO_ERROR;
  // No need to iter->setText() again: The case mapper restarts via iter->first().
  newLength = stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                               getArrayStart(), getCapacity(),
                               oldArray, oldLength, NULL, errorCode);
  if (bufferToDelete) {
    uprv_free(bufferToDelete);
  }
  if (U_SUCCESS(errorCode)) {
    setLength(newLength);
  } else {
    setToBogus();
  }
  return *this;
}